

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O0

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,Graph *g)

{
  StringDictionary *dictionary;
  pool_ptr<const_soul::AST::Graph> local_60 [3];
  Annotation local_48;
  Graph *local_18;
  Graph *g_local;
  HEARTGenerator *this_local;
  
  local_18 = g;
  g_local = (Graph *)this;
  dictionary = Program::getStringDictionary(&this->module->program);
  AST::Annotation::toPlainAnnotation(&local_48,&(g->super_ProcessorBase).annotation,dictionary);
  Annotation::operator=(&this->module->annotation,&local_48);
  Annotation::~Annotation(&local_48);
  pool_ptr<soul::AST::Graph_const>::pool_ptr<soul::AST::Graph,void>
            ((pool_ptr<soul::AST::Graph_const> *)local_60,local_18);
  (this->sourceGraph).object = local_60[0].object;
  pool_ptr<const_soul::AST::Graph>::~pool_ptr(local_60);
  this->parsingStateVariables = true;
  ASTVisitor::visit(&this->super_ASTVisitor,local_18);
  this->parsingStateVariables = false;
  return;
}

Assistant:

void visit (AST::Graph& g) override
    {
        module.annotation = g.annotation.toPlainAnnotation (module.program.getStringDictionary());
        sourceGraph = g;

        parsingStateVariables = true;
        super::visit (g);
        parsingStateVariables = false;
    }